

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DBSCAN.cpp
# Opt level: O3

bool __thiscall DBSCAN::Fit(DBSCAN *this)

{
  pointer pEVar1;
  uint uVar2;
  long *plVar3;
  int clusterId;
  long lVar4;
  ulong uVar5;
  
  uVar2 = this->emb_num;
  if (uVar2 == 0) {
    clusterId = 0;
  }
  else {
    clusterId = 0;
    lVar4 = 0x809;
    uVar5 = 0;
    do {
      pEVar1 = (this->embs).super__Vector_base<Embedding,_std::allocator<Embedding>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((*(char *)((long)pEVar1->emb + lVar4 + -4) == '\0') &&
         (*(char *)((long)pEVar1->emb + lVar4 + 0xfffffffffffffffbU) == '\x01')) {
        *(int *)((long)pEVar1->emb + lVar4 + 0xfffffffffffffff7U) = clusterId;
        *(undefined1 *)((long)pEVar1->emb + lVar4 + -4) = 1;
        KeyEmbCluster(this,(uint)uVar5,clusterId);
        clusterId = clusterId + 1;
        uVar2 = this->emb_num;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x828;
    } while (uVar5 < uVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cluster ID",10);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,clusterId);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return true;
}

Assistant:

bool DBSCAN::Fit()
{
    int clusterId=0;                        //聚类id计数，初始化为0
    for(unsigned long i=0; i<this->emb_num;i++)            //对每一个数据点执行
    {
        Embedding& emb = this->embs[i];                    //取到第i个数据点对象
        if(!emb.IsVisited() && emb.IsKey())            //若对象没被访问过，并且是核心对象执行
        {
            emb.SetClusterID(clusterId);                //设置该对象所属簇ID为clusterId
            emb.SetVisited(true);                    //设置该对象已被访问过
            this->KeyEmbCluster(i, clusterId);            //对该对象领域内点进行聚类
            clusterId++;                            //clusterId自增1
        }
        //cout << "孤立点\T" << i << endl;
    }

    std::cout <<"cluster ID" <<clusterId<<std::endl;        //算法完成后，输出聚类个数
    return true;    //返回
}